

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptOperators::GetIterator
          (RecyclableObject *instance,ScriptContext *scriptContext,bool optional)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  JavascriptMethod p_Var7;
  undefined4 *puVar8;
  
  pRVar6 = GetIteratorFunction(instance,scriptContext,optional);
  if (pRVar6 == (RecyclableObject *)0x0) {
    if (!optional) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2b7e,"(optional)","optional");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    return (RecyclableObject *)0x0;
  }
  this = scriptContext->threadContext;
  bVar4 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(pRVar6);
  bVar3 = ThreadContext::HasNoSideEffect(this,pRVar6,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    pRVar6 = (RecyclableObject *)
             (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,instance);
    bVar3 = ThreadContext::IsOnStack(pRVar6);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar6 = (((((((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00ace197;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      CheckIsExecutable(pRVar6,p_Var7);
      p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
      pRVar6 = (RecyclableObject *)
               (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,instance);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ace197;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    CheckIsExecutable(pRVar6,p_Var7);
    p_Var7 = RecyclableObject::GetEntryPoint(pRVar6);
    pRVar6 = (RecyclableObject *)
             (*p_Var7)(pRVar6,(CallInfo)pRVar6,0x2000001,0,0,0,0,0x2000001,instance);
    bVar3 = ThreadContext::IsOnStack(pRVar6);
  }
  if (bVar3 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ace197:
  this->reentrancySafeOrHandled = bVar4;
  BVar5 = IsObject(pRVar6);
  if (BVar5 != 0) {
    pRVar6 = VarTo<Js::RecyclableObject>(pRVar6);
    return pRVar6;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::GetIterator(RecyclableObject* instance, ScriptContext * scriptContext, bool optional)
    {
        RecyclableObject* function = GetIteratorFunction(instance, scriptContext, optional);

        if (function == nullptr)
        {
            Assert(optional);
            return nullptr;
        }

        Var iterator = scriptContext->GetThreadContext()->ExecuteImplicitCall(function, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), function, CallInfo(Js::CallFlags_Value, 1), instance);
        });

        if (!JavascriptOperators::IsObject(iterator))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return VarTo<RecyclableObject>(iterator);
    }